

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

fdb_status fdb_kvs_close(fdb_kvs_handle *handle)

{
  kvs_info *pkVar1;
  fdb_status fVar2;
  
  if (handle == (fdb_kvs_handle *)0x0) {
    fVar2 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    fVar2 = FDB_RESULT_KV_STORE_BUSY;
    if (handle->num_iterators == 0) {
      if ((handle->shandle == (snap_handle *)0x0) || (handle->kvs != (kvs_info *)0x0)) {
        pkVar1 = handle->kvs;
        if ((pkVar1 == (kvs_info *)0x0) || (pkVar1->type == '\0')) {
          if (handle->fhandle->root == handle) {
            fdb_assert_die("handle->fhandle->root != handle",
                           "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/kv_instance.cc"
                           ,0x78e,(uint64_t)handle,0);
          }
          pthread_spin_lock(&handle->fhandle->lock);
          fVar2 = _fdb_close(handle);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            pthread_spin_unlock(&handle->fhandle->lock);
            return fVar2;
          }
          if (handle->kvs != (kvs_info *)0x0) {
            free(handle->kvs);
            handle->kvs = (kvs_info *)0x0;
          }
          list_remove(handle->fhandle->handles,&handle->node->le);
          pthread_spin_unlock(&handle->fhandle->lock);
          free(handle->node);
          fVar2 = FDB_RESULT_SUCCESS;
        }
        else {
          if (pkVar1->root == (fdb_kvs_handle *)0x0) {
            return FDB_RESULT_INVALID_ARGS;
          }
          fVar2 = _fdb_kvs_close(handle);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            return fVar2;
          }
          fVar2 = FDB_RESULT_SUCCESS;
          if (handle->kvs != (kvs_info *)0x0) {
            free(handle->kvs);
            handle->kvs = (kvs_info *)0x0;
          }
        }
      }
      else {
        fVar2 = _fdb_close(handle);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          return fVar2;
        }
      }
      free(handle);
    }
  }
  return fVar2;
}

Assistant:

fdb_status _fdb_kvs_close(fdb_kvs_handle *handle)
{
    fdb_kvs_handle *root_handle = handle->fhandle->root;
    fdb_status fs;

    if (handle->node) {
        spin_lock(&root_handle->fhandle->lock);
        list_remove(root_handle->fhandle->handles, &handle->node->le);
        spin_unlock(&root_handle->fhandle->lock);
        free(handle->node);
    } // 'handle->node == NULL' happens only during rollback

    fs = _fdb_close(handle);
    return fs;
}